

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O2

double wabt::interp::FloatSqrt<double>(double val)

{
  double dVar1;
  
  if (val < 0.0) {
    dVar1 = sqrt(val);
  }
  else {
    dVar1 = SQRT(val);
  }
  if (NAN(dVar1)) {
    dVar1 = NAN;
  }
  return dVar1;
}

Assistant:

T WABT_VECTORCALL FloatNearest(T val) { return CanonNaN(std::nearbyint(val)); }